

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void __thiscall AGSSockAPI::Beacon::~Beacon(Beacon *this)

{
  close((this->data).fd[0]);
  close((this->data).fd[1]);
  return;
}

Assistant:

Beacon::~Beacon()
{
#ifdef _WIN32
	closesocket(data.fd);
#else
	close(data.fd[0]);
	close(data.fd[1]);
#endif
}